

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.h
# Opt level: O1

uintptr_t __thiscall google::protobuf::internal::MessageCreator::arena_bits(MessageCreator *this)

{
  string *psVar1;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  char acStack_18 [16];
  
  pcVar2 = acStack_18;
  if (this->tag_ == kFunc) {
    psVar1 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       (-1,-1,"+tag() != +kFunc");
  }
  else {
    psVar1 = (string *)0x0;
  }
  if (psVar1 == (string *)0x0) {
    return (uintptr_t)(this->field_3).func_;
  }
  arena_bits();
  lVar4 = (long)psVar1 - (long)pcVar2 >> 2;
  pcVar3 = pcVar2;
  if (0 < lVar4) {
    pcVar3 = pcVar2 + ((long)psVar1 - (long)pcVar2 & 0xfffffffffffffffc);
    lVar4 = lVar4 + 1;
    pcVar2 = pcVar2 + 3;
    do {
      if (pcVar2[-3] != '\0') {
        return (uintptr_t)(pcVar2 + -3);
      }
      if (pcVar2[-2] != '\0') {
        return (uintptr_t)(pcVar2 + -2);
      }
      if (pcVar2[-1] != '\0') {
        return (uintptr_t)(pcVar2 + -1);
      }
      if (*pcVar2 != '\0') {
        return (uintptr_t)pcVar2;
      }
      lVar4 = lVar4 + -1;
      pcVar2 = pcVar2 + 4;
    } while (1 < lVar4);
  }
  lVar4 = (long)psVar1 - (long)pcVar3;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      if (lVar4 != 3) {
        return (uintptr_t)psVar1;
      }
      if (*pcVar3 != '\0') {
        return (uintptr_t)pcVar3;
      }
      pcVar3 = pcVar3 + 1;
    }
    if (*pcVar3 != '\0') {
      return (uintptr_t)pcVar3;
    }
    pcVar3 = pcVar3 + 1;
  }
  if (*pcVar3 != '\0') {
    return (uintptr_t)pcVar3;
  }
  return (uintptr_t)psVar1;
}

Assistant:

uintptr_t arena_bits() const {
    ABSL_DCHECK_NE(+tag(), +kFunc);
    return arena_bits_;
  }